

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O0

void mdct_butterfly_16(float *x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float r1;
  float r0;
  float *x_local;
  
  fVar1 = x[9];
  fVar2 = *x;
  fVar3 = x[8];
  x[8] = *x + x[8];
  x[9] = x[1] + x[9];
  *x = ((x[1] - fVar1) + (fVar2 - fVar3)) * 0.70710677;
  x[1] = ((x[1] - fVar1) - (fVar2 - fVar3)) * 0.70710677;
  fVar1 = x[0xb];
  fVar2 = x[10];
  fVar3 = x[2];
  x[10] = x[2] + x[10];
  x[0xb] = x[3] + x[0xb];
  x[2] = x[3] - fVar1;
  x[3] = fVar2 - fVar3;
  fVar1 = x[0xc];
  fVar2 = x[4];
  fVar3 = x[0xd];
  x[0xc] = x[4] + x[0xc];
  x[0xd] = x[5] + x[0xd];
  x[4] = ((fVar1 - fVar2) - (fVar3 - x[5])) * 0.70710677;
  x[5] = ((fVar1 - fVar2) + (fVar3 - x[5])) * 0.70710677;
  fVar1 = x[0xe];
  fVar2 = x[0xf];
  x[0xe] = x[6] + x[0xe];
  x[0xf] = x[7] + x[0xf];
  x[6] = fVar1 - x[6];
  x[7] = fVar2 - x[7];
  mdct_butterfly_8(x);
  mdct_butterfly_8(x + 8);
  return;
}

Assistant:

STIN void mdct_butterfly_16(DATA_TYPE *x){
  REG_TYPE r0     = x[1]  - x[9];
  REG_TYPE r1     = x[0]  - x[8];

           x[8]  += x[0];
           x[9]  += x[1];
           x[0]   = MULT_NORM((r0   + r1) * cPI2_8);
           x[1]   = MULT_NORM((r0   - r1) * cPI2_8);

           r0     = x[3]  - x[11];
           r1     = x[10] - x[2];
           x[10] += x[2];
           x[11] += x[3];
           x[2]   = r0;
           x[3]   = r1;

           r0     = x[12] - x[4];
           r1     = x[13] - x[5];
           x[12] += x[4];
           x[13] += x[5];
           x[4]   = MULT_NORM((r0   - r1) * cPI2_8);
           x[5]   = MULT_NORM((r0   + r1) * cPI2_8);

           r0     = x[14] - x[6];
           r1     = x[15] - x[7];
           x[14] += x[6];
           x[15] += x[7];
           x[6]  = r0;
           x[7]  = r1;

           mdct_butterfly_8(x);
           mdct_butterfly_8(x+8);
}